

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

WebPEncodingError
VP8LEncodeStream(WebPConfig *config,WebPPicture *picture,VP8LBitWriter *bw_main,int use_cache)

{
  undefined8 *puVar1;
  uint32_t a;
  WebPConfig *pWVar2;
  WebPPicture *pic;
  WebPAuxStats *pWVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  WebPWorker *pWVar11;
  WebPWorker *pWVar12;
  WebPWorker *pWVar13;
  VP8LBitWriter *src;
  uint32_t uVar14;
  int iVar15;
  int iVar16;
  VP8LEncoder *enc;
  WebPWorkerInterface *pWVar17;
  uint32_t *puVar18;
  VP8LEncoder *enc_00;
  uint8_t *puVar19;
  StreamEncodeContext *pSVar20;
  byte bVar21;
  PaletteSorting *pPVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint32_t *puVar27;
  WebPWorker *pWVar28;
  int iVar29;
  PaletteSorting PVar30;
  ulong uVar31;
  PaletteSorting PVar32;
  int *piVar33;
  ulong uVar34;
  int iVar35;
  uint32_t *puVar36;
  uint uVar37;
  WebPEncodingError WVar38;
  bool bVar39;
  float fVar40;
  PaletteSorting local_578;
  int local_574;
  VP8LEncoder *local_570;
  uint32_t *local_568;
  VP8LEncoder *local_560;
  uint32_t *local_558;
  WebPPicture *local_550;
  uint32_t *local_548;
  VP8LBitWriter *local_540;
  WebPConfig *local_538;
  uint32_t *local_530;
  int local_528;
  uint local_524;
  uint local_520;
  int local_51c;
  int local_518;
  int local_514;
  ulong local_510;
  ulong local_508;
  WebPWorkerInterface *local_500;
  uint32_t *local_4f8;
  uint32_t *local_4f0;
  uint32_t *local_4e8;
  uint32_t *local_4e0;
  uint32_t *local_4d8;
  WebPConfig *local_4d0;
  uint32_t *local_4c8;
  uint32_t *local_4c0;
  uint32_t *local_4b8;
  uint32_t *local_4b0;
  uint32_t *local_4a8;
  uint32_t *local_4a0;
  VP8LBitWriter bw_side;
  WebPWorker worker_side;
  WebPWorker worker_main;
  StreamEncodeContext params_main;
  CrunchConfig crunch_configs [8];
  StreamEncodeContext params_side;
  WebPAuxStats stats_side;
  
  pPVar22 = &local_578;
  local_550 = picture;
  local_538 = config;
  local_518 = use_cache;
  enc = VP8LEncoderNew(config,picture);
  pWVar17 = WebPGetWorkerInterface();
  if (enc == (VP8LEncoder *)0x0) {
LAB_0012f636:
    enc_00 = (VP8LEncoder *)0x0;
LAB_0012f639:
    WVar38 = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    pWVar2 = enc->config_;
    pic = enc->pic_;
    local_510 = (ulong)(uint)pic->width;
    local_508 = (ulong)(uint)pic->height;
    iVar15 = pWVar2->method;
    puVar27 = enc->palette_sorted_;
    local_540 = bw_main;
    local_500 = pWVar17;
    local_574 = WebPGetColorPalette(pic,puVar27);
    enc->palette_size_ = local_574;
    local_4d0 = pWVar2;
    if (local_574 < 0x101) {
      qsort(puVar27,(long)local_574,4,PaletteCompareColorsForQsort);
      uVar24 = 9;
    }
    else {
      enc->palette_size_ = 0;
      uVar24 = 7;
    }
    iVar16 = 1;
    uVar24 = uVar24 - iVar15;
    do {
      uVar37 = uVar24;
      bVar21 = (byte)uVar37;
      iVar29 = 1 << (bVar21 & 0x1f);
      uVar24 = uVar37 + 1;
    } while (0xa28 < (int)(((uint)(iVar29 + pic->height + -1) >> (bVar21 & 0x1f)) *
                          ((uint)(pic->width + -1 + iVar29) >> (bVar21 & 0x1f))));
    uVar24 = 6;
    if (3 < iVar15) {
      uVar24 = iVar15 == 4 | 4;
    }
    uVar26 = 9;
    if ((int)uVar37 < 9) {
      uVar26 = uVar37;
    }
    if ((int)uVar26 < 3) {
      uVar26 = 2;
    }
    if (uVar26 <= uVar24) {
      uVar24 = uVar26;
    }
    enc->histo_bits_ = uVar26;
    enc->transform_bits_ = uVar24;
    local_570 = enc;
    local_4c8 = puVar27;
    if (iVar15 == 0) {
      crunch_configs[0].entropy_idx_ = (local_574 < 0x101) + 3;
      crunch_configs[0].palette_sorting_type_ = (uint)(0x100 < local_574) * 3;
      uVar37 = 1;
      iVar16 = 0;
      iVar15 = 0;
LAB_0012ed99:
      *pPVar22 = kMinimizeDelta;
    }
    else {
      iVar29 = enc->palette_size_;
      uVar37 = (iVar29 < 0x11) + 1;
      if (iVar29 < 1) {
        uVar37 = 1;
      }
      if (local_574 < 0x101 && iVar29 < 0x11) {
        iVar29 = 4;
        iVar35 = local_574;
      }
      else {
        puVar27 = pic->argb;
        iVar16 = pic->argb_stride;
        local_520 = uVar24;
        local_51c = iVar29;
        puVar18 = (uint32_t *)WebPSafeCalloc(0xd,0x400);
        enc_00 = (VP8LEncoder *)0x0;
        if (puVar18 == (uint32_t *)0x0) {
          WVar38 = VP8_ENC_ERROR_OUT_OF_MEMORY;
          enc = local_570;
          goto LAB_0012f63d;
        }
        uVar14 = *puVar27;
        local_4a0 = puVar18 + 0x400;
        local_4a8 = puVar18 + 0x200;
        local_4b0 = puVar18 + 0x600;
        local_558 = puVar18 + 0x100;
        local_4d8 = puVar18 + 0x500;
        local_4e0 = puVar18 + 0x300;
        local_4e8 = puVar18 + 0x700;
        local_4b8 = puVar18 + 0x800;
        local_4c0 = puVar18 + 0xa00;
        local_4f0 = puVar18 + 0x900;
        local_4f8 = puVar18 + 0xb00;
        uVar25 = 0;
        if (0 < (int)local_510) {
          uVar25 = local_510 & 0xffffffff;
        }
        local_514 = 0;
        if (0 < (int)local_508) {
          local_514 = (int)local_508;
        }
        puVar36 = (uint32_t *)0x0;
        local_568 = puVar18;
        local_528 = iVar15;
        local_524 = uVar37;
        while (uVar37 = local_524, iVar15 = local_528, iVar35 = local_574, local_548 = puVar27,
              (int)enc_00 != local_514) {
          local_560 = enc_00;
          local_530 = puVar36;
          for (uVar31 = 0; uVar25 != uVar31; uVar31 = uVar31 + 1) {
            a = local_548[uVar31];
            uVar14 = VP8LSubPixels(a,uVar14);
            puVar27 = local_568;
            if ((uVar14 != 0) && ((puVar36 == (uint32_t *)0x0 || (a != puVar36[uVar31])))) {
              AddSingle(a,local_568,local_4a0,local_4a8,local_4b0);
              AddSingle(uVar14,local_558,local_4d8,local_4e0,local_4e8);
              AddSingleSubGreen(a,local_4b8,local_4c0);
              AddSingleSubGreen(uVar14,local_4f0,local_4f8);
              piVar33 = (int *)((long)puVar27 +
                               (ulong)(((a >> 0x13) + a) * 0x39c5fba7 >> 0x16 & 0xfffffffc) + 0x3000
                               );
              *piVar33 = *piVar33 + 1;
              puVar36 = local_530;
            }
            uVar14 = a;
          }
          puVar27 = local_548 + iVar16;
          puVar36 = local_548;
          enc_00 = (VP8LEncoder *)(ulong)((int)local_560 + 1);
        }
        *local_4f0 = *local_4f0 + 1;
        *local_4f8 = *local_4f8 + 1;
        *local_4d8 = *local_4d8 + 1;
        *local_4e0 = *local_4e0 + 1;
        *local_4e8 = *local_4e8 + 1;
        *local_558 = *local_558 + 1;
        puVar27 = local_568;
        for (lVar23 = 0; enc = local_570, lVar23 != 0xd; lVar23 = lVar23 + 1) {
          dVar5 = VP8LBitsEntropy(puVar27,0x100);
          *(double *)&params_main.crunch_configs_[0].sub_configs_[lVar23 + -6].do_no_cache_ = dVar5;
          puVar27 = puVar27 + 0x100;
        }
        iVar16 = 1;
        bVar21 = (byte)local_520;
        iVar29 = 1 << (bVar21 & 0x1f);
        fVar40 = (float)(((iVar29 + (int)local_508) - 1U >> (bVar21 & 0x1f)) *
                        (((int)local_510 + iVar29) - 1U >> (bVar21 & 0x1f)));
        params_side.config_ =
             (WebPConfig *)
             ((double)params_main.bw_ + (double)params_main._32_8_ + (double)params_main.config_ +
             (double)params_main.crunch_configs_[0].sub_configs_._4_8_);
        params_side.picture_ =
             (WebPPicture *)
             ((double)params_main.crunch_configs_[0]._20_8_ +
              (double)params_main.enc_ +
              (double)params_main.crunch_configs_[0]._4_8_ + (double)params_main.picture_ +
             (double)(fVar40 * 3.807355));
        params_side.bw_ =
             (VP8LBitWriter *)
             ((double)params_main.bw_ +
              (double)params_main.config_ + (double)params_main.crunch_configs_[1]._0_8_ +
             (double)params_main.crunch_configs_[1].sub_configs_[1]);
        dVar5 = (double)params_main.crunch_configs_._52_8_ +
                (double)params_main.enc_ +
                (double)params_main.picture_ +
                (double)params_main.crunch_configs_[1].sub_configs_[0] +
                (double)(fVar40 * 4.5849624);
        auVar4._8_4_ = SUB84(dVar5,0);
        auVar4._0_8_ = params_side.bw_;
        auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
        params_side.enc_ = (VP8LEncoder *)auVar4._8_8_;
        params_side._32_8_ = (double)(local_51c << 3) + (double)params_main.crunch_configs_[2]._4_8_
        ;
        uVar31 = 0;
        uVar24 = 0;
        for (uVar25 = 1; iVar29 = (int)uVar31, ((ulong)(iVar35 < 0x101) | 4) != uVar25;
            uVar25 = uVar25 + 1) {
          dVar5 = *(double *)
                   &params_side.crunch_configs_[0].sub_configs_[(ulong)uVar24 - 6].do_no_cache_;
          piVar33 = &params_side.crunch_configs_[0].sub_configs_[uVar25 - 6].do_no_cache_;
          uVar34 = uVar25 & 0xffffffff;
          uVar26 = (uint)uVar25;
          if (dVar5 < *(double *)piVar33 || dVar5 == *(double *)piVar33) {
            uVar34 = uVar31;
            uVar26 = uVar24;
          }
          uVar24 = uVar26;
          uVar31 = uVar34;
        }
        lVar23 = 1;
        do {
          if (lVar23 == 0x100) goto LAB_0012f1df;
          lVar9 = (ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar31 * 2 + 1] * 0x100 + lVar23;
          lVar10 = (ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar31 * 2] * 0x100 + lVar23;
          lVar23 = lVar23 + 1;
        } while (local_568[lVar9] == 0 && local_568[lVar10] == 0);
        iVar16 = 0;
LAB_0012f1df:
        WebPSafeFree(local_568);
      }
      fVar40 = local_4d0->quality;
      if (((iVar15 != 6) || (fVar40 != 100.0)) || (NAN(fVar40))) {
        local_578 = kMinimizeDelta;
        crunch_configs[0].palette_sorting_type_ = (uint)(0x100 < iVar35) * 2 + kMinimizeDelta;
        crunch_configs[0].entropy_idx_ = iVar29;
        if (iVar15 != 5 || fVar40 < 75.0) {
          iVar15 = 0;
        }
        else {
          if (iVar29 == 4) {
            local_578 = kModifiedZeng;
            pPVar22 = &crunch_configs[1].palette_sorting_type_;
            crunch_configs[1].entropy_idx_ = 5;
            iVar15 = 1;
            goto LAB_0012ed99;
          }
          iVar15 = 1;
        }
      }
      else {
        local_578 = kSortedDefault;
        PVar30 = kSortedDefault;
        for (uVar24 = 0; uVar24 != 6; uVar24 = uVar24 + 1) {
          if (iVar35 < 0x101 || uVar24 < 4) {
            crunch_configs[(int)PVar30].entropy_idx_ = uVar24;
            PVar32 = kUnusedPalette;
            PVar30 = local_578;
            if ((uVar24 & 6) == 4 && iVar35 < 0x101) {
              PVar30 = local_578 + kMinimizeDelta;
              crunch_configs[(int)PVar30].entropy_idx_ = uVar24;
              crunch_configs[(int)PVar30].palette_sorting_type_ = kModifiedZeng;
              PVar32 = kMinimizeDelta;
            }
            crunch_configs[(int)local_578].palette_sorting_type_ = PVar32;
            PVar30 = PVar30 + kMinimizeDelta;
            local_578 = PVar30;
          }
        }
        iVar15 = 1;
      }
    }
    PVar30 = local_578;
    uVar25 = 0;
    uVar31 = 0;
    if (0 < (int)local_578) {
      uVar31 = (ulong)local_578;
    }
    piVar33 = &crunch_configs[0].sub_configs_[0].do_no_cache_;
    for (; uVar25 != uVar31; uVar25 = uVar25 + 1) {
      for (uVar34 = 0; uVar37 != uVar34; uVar34 = uVar34 + 1) {
        piVar33[uVar34 * 2 + -1] = 4 - (uint)(uVar34 == 0);
        piVar33[uVar34 * 2] = iVar15;
      }
      crunch_configs[uVar25].sub_configs_size_ = uVar37;
      piVar33 = piVar33 + 7;
    }
    iVar15 = EncoderInit(enc);
    WVar38 = VP8_ENC_ERROR_OUT_OF_MEMORY;
    if (iVar15 != 0) {
      puVar27 = (uint32_t *)0x0;
      iVar15 = VP8LBitWriterInit(&bw_side,0);
      if (iVar15 != 0) {
        if (0 < local_538->thread_level) {
          uVar25 = (long)(int)PVar30 / 2;
          puVar27 = (uint32_t *)(uVar25 & 0xffffffff);
          iVar15 = (int)uVar25;
          lVar23 = 0;
          uVar25 = uVar25 & 0xffffffff;
          if (iVar15 < 1) {
            uVar25 = 0;
          }
          for (; uVar25 * 0x1c - lVar23 != 0; lVar23 = lVar23 + 0x1c) {
            puVar1 = (undefined8 *)
                     ((long)&((CrunchConfig *)
                             (crunch_configs[(int)(PVar30 - iVar15)].sub_configs_ + -1))->
                             entropy_idx_ + lVar23);
            uVar6 = *puVar1;
            uVar7 = puVar1[1];
            puVar1 = (undefined8 *)
                     ((long)&crunch_configs[(int)(PVar30 - iVar15)].sub_configs_[0].do_no_cache_ +
                     lVar23);
            uVar8 = puVar1[1];
            *(undefined8 *)
             ((long)&params_side.crunch_configs_[0].sub_configs_[0].do_no_cache_ + lVar23) = *puVar1
            ;
            *(undefined8 *)
             ((long)&params_side.crunch_configs_[0].sub_configs_[1].do_no_cache_ + lVar23) = uVar8;
            *(undefined8 *)
             ((long)&((CrunchConfig *)(params_side.crunch_configs_[0].sub_configs_ + -1))->
                     entropy_idx_ + lVar23) = uVar6;
            *(undefined8 *)((long)&params_side.crunch_configs_[0].sub_configs_[0].lz77_ + lVar23) =
                 uVar7;
          }
          params_side.num_crunch_configs_ = iVar15;
        }
        local_578 = PVar30 - (int)puVar27;
        lVar23 = 0;
        uVar25 = 0;
        if (0 < (int)local_578) {
          uVar25 = (ulong)local_578;
        }
        for (; uVar25 * 0x1c - lVar23 != 0; lVar23 = lVar23 + 0x1c) {
          uVar6 = *(undefined8 *)
                   ((long)&((CrunchConfig *)(crunch_configs[0].sub_configs_ + -1))->entropy_idx_ +
                   lVar23);
          uVar7 = *(undefined8 *)((long)&crunch_configs[0].sub_configs_[0].lz77_ + lVar23);
          uVar8 = *(undefined8 *)((long)&crunch_configs[0].sub_configs_[1].do_no_cache_ + lVar23);
          *(undefined8 *)
           ((long)&params_main.crunch_configs_[0].sub_configs_[0].do_no_cache_ + lVar23) =
               *(undefined8 *)((long)&crunch_configs[0].sub_configs_[0].do_no_cache_ + lVar23);
          *(undefined8 *)
           ((long)&params_main.crunch_configs_[0].sub_configs_[1].do_no_cache_ + lVar23) = uVar8;
          *(undefined8 *)
           ((long)&((CrunchConfig *)(params_main.crunch_configs_[0].sub_configs_ + -1))->
                   entropy_idx_ + lVar23) = uVar6;
          *(undefined8 *)((long)&params_main.crunch_configs_[0].sub_configs_[0].lz77_ + lVar23) =
               uVar7;
        }
        local_548 = (uint32_t *)CONCAT44(local_548._4_4_,(0 < (int)puVar27) + 1);
        local_568 = enc->palette_;
        local_560 = (VP8LEncoder *)0x0;
        local_530 = (uint32_t *)CONCAT44(local_530._4_4_,iVar16);
        local_558 = puVar27;
        params_main.num_crunch_configs_ = local_578;
        for (iVar15 = 0; puVar27 = local_4c8, pWVar17 = local_500, enc_00 = local_560,
            (int)local_548 != iVar15; iVar15 = iVar15 + 1) {
          bVar39 = iVar15 == 0;
          pWVar28 = &worker_side;
          if (bVar39) {
            pWVar28 = &worker_main;
          }
          pSVar20 = &params_side;
          if (bVar39) {
            pSVar20 = &params_main;
          }
          pSVar20->config_ = local_538;
          pSVar20->picture_ = local_550;
          pSVar20->use_cache_ = local_518;
          pSVar20->red_and_blue_always_zero_ = iVar16;
          pWVar3 = local_550->stats;
          if (bVar39) {
            params_main.bw_ = local_540;
            pWVar11 = &worker_main;
            pWVar12 = &worker_main;
            pWVar13 = &worker_main;
            params_main.enc_ = enc;
            params_main.stats_ = pWVar3;
          }
          else {
            params_side.stats_ = pWVar3;
            if (pWVar3 != (WebPAuxStats *)0x0) {
              params_side.stats_ = &stats_side;
            }
            iVar16 = VP8LBitWriterClone(local_540,&bw_side);
            enc_00 = local_560;
            if (iVar16 == 0) goto LAB_0012f639;
            params_side.bw_ = &bw_side;
            enc_00 = VP8LEncoderNew(local_538,local_550);
            if (enc_00 == (VP8LEncoder *)0x0) goto LAB_0012f636;
            iVar16 = EncoderInit(enc_00);
            if (iVar16 == 0) goto LAB_0012f639;
            iVar16 = enc->transform_bits_;
            enc_00->histo_bits_ = enc->histo_bits_;
            enc_00->transform_bits_ = iVar16;
            enc_00->palette_size_ = enc->palette_size_;
            memcpy(enc_00->palette_,local_568,0x400);
            memcpy(enc_00->palette_sorted_,puVar27,0x400);
            params_side.enc_ = enc_00;
            pWVar11 = &worker_side;
            pWVar12 = &worker_side;
            pWVar13 = &worker_side;
            local_560 = enc_00;
          }
          (*local_500->Init)(pWVar28);
          pWVar11->data1 = pSVar20;
          pWVar12->data2 = (void *)0x0;
          pWVar13->hook = EncodeStreamHook;
          enc = local_570;
          iVar16 = (int)local_530;
        }
        if ((int)local_558 != 0) {
          iVar15 = (*local_500->Reset)(&worker_side);
          if (iVar15 == 0) goto LAB_0012f639;
          if (local_550->stats != (WebPAuxStats *)0x0) {
            memcpy(&stats_side,local_550->stats,0xbc);
          }
          params_side.err_ = VP8_ENC_OK;
          (*pWVar17->Launch)(&worker_side);
        }
        (*pWVar17->Execute)(&worker_main);
        iVar15 = (*pWVar17->Sync)(&worker_main);
        (*pWVar17->End)(&worker_main);
        if ((int)local_558 == 0) {
          enc = local_570;
          WVar38 = VP8_ENC_OK;
          if (iVar15 == 0) {
            WVar38 = params_main.err_;
          }
        }
        else {
          iVar16 = (*pWVar17->Sync)(&worker_side);
          (*pWVar17->End)(&worker_side);
          src = local_540;
          if ((iVar15 == 0) || (iVar16 == 0)) {
            pSVar20 = &params_main;
            if (iVar15 != 0) {
              pSVar20 = &params_side;
            }
            WVar38 = pSVar20->err_;
            enc = local_570;
          }
          else {
            puVar19 = (uint8_t *)VP8LBitWriterNumBytes(local_540);
            enc = local_570;
            if (bw_side.cur_ + ((long)(bw_side.used_ + 7 >> 3) - (long)bw_side.buf_) < puVar19) {
              VP8LBitWriterSwap(src,&bw_side);
              if (local_550->stats != (WebPAuxStats *)0x0) {
                memcpy(local_550->stats,&stats_side,0xbc);
              }
            }
            WVar38 = VP8_ENC_OK;
          }
        }
        goto LAB_0012f63d;
      }
    }
    enc_00 = (VP8LEncoder *)0x0;
  }
LAB_0012f63d:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc);
  VP8LEncoderDelete(enc_00);
  return WVar38;
}

Assistant:

WebPEncodingError VP8LEncodeStream(const WebPConfig* const config,
                                   const WebPPicture* const picture,
                                   VP8LBitWriter* const bw_main,
                                   int use_cache) {
  WebPEncodingError err = VP8_ENC_OK;
  VP8LEncoder* const enc_main = VP8LEncoderNew(config, picture);
  VP8LEncoder* enc_side = NULL;
  CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX];
  int num_crunch_configs_main, num_crunch_configs_side = 0;
  int idx;
  int red_and_blue_always_zero = 0;
  WebPWorker worker_main, worker_side;
  StreamEncodeContext params_main, params_side;
  // The main thread uses picture->stats, the side thread uses stats_side.
  WebPAuxStats stats_side;
  VP8LBitWriter bw_side;
  const WebPWorkerInterface* const worker_interface = WebPGetWorkerInterface();
  int ok_main;

  // Analyze image (entropy, num_palettes etc)
  if (enc_main == NULL ||
      !EncoderAnalyze(enc_main, crunch_configs, &num_crunch_configs_main,
                      &red_and_blue_always_zero) ||
      !EncoderInit(enc_main) || !VP8LBitWriterInit(&bw_side, 0)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // Split the configs between the main and side threads (if any).
  if (config->thread_level > 0) {
    num_crunch_configs_side = num_crunch_configs_main / 2;
    for (idx = 0; idx < num_crunch_configs_side; ++idx) {
      params_side.crunch_configs_[idx] =
          crunch_configs[num_crunch_configs_main - num_crunch_configs_side +
                         idx];
    }
    params_side.num_crunch_configs_ = num_crunch_configs_side;
  }
  num_crunch_configs_main -= num_crunch_configs_side;
  for (idx = 0; idx < num_crunch_configs_main; ++idx) {
    params_main.crunch_configs_[idx] = crunch_configs[idx];
  }
  params_main.num_crunch_configs_ = num_crunch_configs_main;

  // Fill in the parameters for the thread workers.
  {
    const int params_size = (num_crunch_configs_side > 0) ? 2 : 1;
    for (idx = 0; idx < params_size; ++idx) {
      // Create the parameters for each worker.
      WebPWorker* const worker = (idx == 0) ? &worker_main : &worker_side;
      StreamEncodeContext* const param =
          (idx == 0) ? &params_main : &params_side;
      param->config_ = config;
      param->picture_ = picture;
      param->use_cache_ = use_cache;
      param->red_and_blue_always_zero_ = red_and_blue_always_zero;
      if (idx == 0) {
        param->stats_ = picture->stats;
        param->bw_ = bw_main;
        param->enc_ = enc_main;
      } else {
        param->stats_ = (picture->stats == NULL) ? NULL : &stats_side;
        // Create a side bit writer.
        if (!VP8LBitWriterClone(bw_main, &bw_side)) {
          err = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto Error;
        }
        param->bw_ = &bw_side;
        // Create a side encoder.
        enc_side = VP8LEncoderNew(config, picture);
        if (enc_side == NULL || !EncoderInit(enc_side)) {
          err = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto Error;
        }
        // Copy the values that were computed for the main encoder.
        enc_side->histo_bits_ = enc_main->histo_bits_;
        enc_side->transform_bits_ = enc_main->transform_bits_;
        enc_side->palette_size_ = enc_main->palette_size_;
        memcpy(enc_side->palette_, enc_main->palette_,
               sizeof(enc_main->palette_));
        memcpy(enc_side->palette_sorted_, enc_main->palette_sorted_,
               sizeof(enc_main->palette_sorted_));
        param->enc_ = enc_side;
      }
      // Create the workers.
      worker_interface->Init(worker);
      worker->data1 = param;
      worker->data2 = NULL;
      worker->hook = EncodeStreamHook;
    }
  }

  // Start the second thread if needed.
  if (num_crunch_configs_side != 0) {
    if (!worker_interface->Reset(&worker_side)) {
      err = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto Error;
    }
#if !defined(WEBP_DISABLE_STATS)
    // This line is here and not in the param initialization above to remove a
    // Clang static analyzer warning.
    if (picture->stats != NULL) {
      memcpy(&stats_side, picture->stats, sizeof(stats_side));
    }
#endif
    // This line is only useful to remove a Clang static analyzer warning.
    params_side.err_ = VP8_ENC_OK;
    worker_interface->Launch(&worker_side);
  }
  // Execute the main thread.
  worker_interface->Execute(&worker_main);
  ok_main = worker_interface->Sync(&worker_main);
  worker_interface->End(&worker_main);
  if (num_crunch_configs_side != 0) {
    // Wait for the second thread.
    const int ok_side = worker_interface->Sync(&worker_side);
    worker_interface->End(&worker_side);
    if (!ok_main || !ok_side) {
      err = ok_main ? params_side.err_ : params_main.err_;
      goto Error;
    }
    if (VP8LBitWriterNumBytes(&bw_side) < VP8LBitWriterNumBytes(bw_main)) {
      VP8LBitWriterSwap(bw_main, &bw_side);
#if !defined(WEBP_DISABLE_STATS)
      if (picture->stats != NULL) {
        memcpy(picture->stats, &stats_side, sizeof(*picture->stats));
      }
#endif
    }
  } else {
    if (!ok_main) {
      err = params_main.err_;
      goto Error;
    }
  }

Error:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc_main);
  VP8LEncoderDelete(enc_side);
  return err;
}